

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
ComputeResponse(string *key,vector<unsigned_char,_std::allocator<unsigned_char>_> *cookie,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *clientNonce,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *serverNonce)

{
  long lVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  CHMAC_SHA256 *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *computedHash;
  CHMAC_SHA256 computeHash;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  uchar *in_stack_fffffffffffffea0;
  CHMAC_SHA256 *in_stack_fffffffffffffea8;
  CHMAC_SHA256 *in_stack_fffffffffffffeb0;
  value_type_conflict *in_stack_fffffffffffffeb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                   (in_stack_fffffffffffffe98);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            (in_stack_fffffffffffffe98);
  CHMAC_SHA256::CHMAC_SHA256
            (in_stack_fffffffffffffeb0,(uchar *)in_stack_fffffffffffffea8,
             (size_t)in_stack_fffffffffffffea0);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffe98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (this,(size_type)in_RDI,in_stack_fffffffffffffeb8,
             (allocator_type *)in_stack_fffffffffffffeb0);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffe98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe98);
  CHMAC_SHA256::Write(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                      (size_t)in_stack_fffffffffffffe98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe98);
  CHMAC_SHA256::Write(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                      (size_t)in_stack_fffffffffffffe98);
  this_00 = (CHMAC_SHA256 *)
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffe98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe98);
  CHMAC_SHA256::Write(this_00,in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe98);
  CHMAC_SHA256::Finalize(this_00,in_stack_fffffffffffffea0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static std::vector<uint8_t> ComputeResponse(const std::string &key, const std::vector<uint8_t> &cookie,  const std::vector<uint8_t> &clientNonce, const std::vector<uint8_t> &serverNonce)
{
    CHMAC_SHA256 computeHash((const uint8_t*)key.data(), key.size());
    std::vector<uint8_t> computedHash(CHMAC_SHA256::OUTPUT_SIZE, 0);
    computeHash.Write(cookie.data(), cookie.size());
    computeHash.Write(clientNonce.data(), clientNonce.size());
    computeHash.Write(serverNonce.data(), serverNonce.size());
    computeHash.Finalize(computedHash.data());
    return computedHash;
}